

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ec_pubkey_parse_pointtest(uchar *input,int xvalid,int yvalid)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  secp256k1_context *psVar10;
  int iVar11;
  long lVar12;
  undefined8 *extraout_RDX;
  uint uVar13;
  secp256k1_ge *ge_00;
  secp256k1_context *psVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_result;
  size_t outl;
  unsigned_long _zzq_args [6];
  secp256k1_pubkey pubkey;
  uchar pubkeyc [65];
  secp256k1_ge ge;
  undefined8 local_1d8;
  secp256k1_ge *local_1d0;
  size_t local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  size_t local_1a8;
  int local_1a0;
  uint local_19c;
  undefined1 local_198 [104];
  ulong local_130;
  undefined1 local_128 [105];
  undefined8 uStack_bf;
  undefined8 local_b7;
  undefined8 uStack_af;
  secp256k1_ge local_98;
  
  local_198._80_8_ = 3;
  local_1a0 = xvalid;
  local_198._88_4_ = yvalid;
  local_198._96_8_ = input;
  do {
    bVar19 = local_1a0 != 0;
    local_128._65_8_ = *(undefined8 *)input;
    local_128._73_8_ = *(undefined8 *)(input + 8);
    local_128._81_8_ = *(undefined8 *)(input + 0x10);
    local_128._89_8_ = *(undefined8 *)(input + 0x18);
    local_128._97_8_ = *(undefined8 *)(input + 0x20);
    uStack_bf = *(undefined8 *)(input + 0x28);
    local_b7 = *(undefined8 *)(input + 0x30);
    uStack_af = *(undefined8 *)(input + 0x38);
    bVar20 = local_198._80_8_ == 0x21;
    local_198._92_4_ = (uint)(local_198._80_8_ == 0x41) * 4;
    local_130 = (ulong)(local_198._80_8_ == 0x41 || bVar20);
    uVar13 = 0;
    do {
      local_128[0x40] = (char)uVar13;
      uVar18 = input[0x3f] & 1 | 2;
      if ((local_1a0 == 0 || local_198._88_4_ == 0) || (uVar13 & 4) != local_198._92_4_) {
        bVar17 = 0;
      }
      else {
        bVar17 = ((uVar13 & 0xfb) == uVar18 || uVar13 == 4) & (byte)local_130;
      }
      psVar14 = CTX;
      if ((((bVar19 && bVar20) && (uVar13 & 0xfe) == 2) | bVar17) != 1) {
        local_128._48_8_ = 0xfefefefefefefefe;
        local_128._56_8_ = 0xfefefefefefefefe;
        local_128._32_8_ = 0xfefefefefefefefe;
        local_128._40_4_ = -0x1010102;
        local_128._44_4_ = -0x1010102;
        local_128._16_8_ = 0xfefefefefefefefe;
        local_128._24_8_ = 0xfefefefefefefefe;
        local_128._0_8_ = 0xfefefefefefefefe;
        local_128._8_8_ = 0xfefefefefefefefe;
        local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
        local_198._16_8_ = 0x40;
        local_198._24_8_ = 0;
        local_198._32_8_ = 0;
        local_198._40_4_ = 0;
        local_198._44_4_ = 0;
        local_1d8 = 0;
        ge_00 = (secp256k1_ge *)local_128;
        local_198._8_8_ = (secp256k1_ge *)local_128;
        iVar11 = secp256k1_ec_pubkey_parse
                           (CTX,(secp256k1_pubkey *)local_128,local_128 + 0x40,local_198._80_8_);
        psVar10 = CTX;
        if (iVar11 != 0) {
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_00159ce4;
        }
        local_198._16_8_ = 0x40;
        local_198._24_8_ = 0;
        local_198._32_8_ = 0;
        local_198._40_4_ = 0;
        local_198._44_4_ = 0;
        local_1d8 = 0;
        local_198._0_8_ = (CTX->illegal_callback).fn;
        local_198._8_8_ = (CTX->illegal_callback).data;
        if (CTX == &secp256k1_context_static_) {
          secp256k1_default_illegal_callback_fn("ctx != secp256k1_context_static",(void *)0x0);
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar10->illegal_callback).data = &local_1d8;
        }
        ge_00 = &local_98;
        psVar14 = CTX;
        iVar11 = secp256k1_pubkey_load(CTX,ge_00,(secp256k1_pubkey *)local_128);
        psVar10 = CTX;
        if (iVar11 != 0) goto LAB_00159cee;
        (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_198._0_8_;
        (psVar10->illegal_callback).data = (void *)local_198._8_8_;
        if ((int)local_1d8 == 1) goto LAB_00159c9a;
LAB_00159cf3:
        ec_pubkey_parse_pointtest_cold_3();
LAB_00159cf8:
        ec_pubkey_parse_pointtest_cold_4();
LAB_00159cfd:
        ec_pubkey_parse_pointtest_cold_5();
LAB_00159d02:
        ec_pubkey_parse_pointtest_cold_12();
LAB_00159d07:
        ec_pubkey_parse_pointtest_cold_6();
LAB_00159d0c:
        ec_pubkey_parse_pointtest_cold_11();
LAB_00159d11:
        ec_pubkey_parse_pointtest_cold_10();
LAB_00159d16:
        ec_pubkey_parse_pointtest_cold_7();
LAB_00159d1b:
        ec_pubkey_parse_pointtest_cold_8();
LAB_00159d20:
        ec_pubkey_parse_pointtest_cold_9();
        *(undefined1 *)&(psVar14->ecmult_gen_ctx).built = 4;
        uVar4 = (ge_00->x).n[1];
        uVar5 = (ge_00->x).n[2];
        uVar6 = (ge_00->x).n[3];
        *(uint64_t *)((long)&(psVar14->ecmult_gen_ctx).built + 1) = (ge_00->x).n[0];
        *(uint64_t *)((long)(psVar14->ecmult_gen_ctx).scalar_offset.d + 1) = uVar4;
        *(uint64_t *)((long)(psVar14->ecmult_gen_ctx).scalar_offset.d + 9) = uVar5;
        *(uint64_t *)((long)(psVar14->ecmult_gen_ctx).scalar_offset.d + 0x11) = uVar6;
        uVar7 = extraout_RDX[1];
        uVar8 = extraout_RDX[2];
        uVar9 = extraout_RDX[3];
        *(undefined8 *)((long)(psVar14->ecmult_gen_ctx).scalar_offset.d + 0x19) = *extraout_RDX;
        *(undefined8 *)((long)(psVar14->ecmult_gen_ctx).ge_offset.x.n + 1) = uVar7;
        *(undefined8 *)((long)(psVar14->ecmult_gen_ctx).ge_offset.x.n + 9) = uVar8;
        *(undefined8 *)((long)(psVar14->ecmult_gen_ctx).ge_offset.x.n + 0x11) = uVar9;
        return;
      }
      local_128._0_8_ = 0;
      local_128._8_8_ = 0;
      local_128._16_8_ = 0;
      local_128._24_8_ = 0;
      local_128._32_8_ = 0;
      local_128._40_4_ = 0;
      local_128._44_4_ = 0;
      local_128._48_8_ = 0;
      local_128._56_8_ = 0;
      local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430001;
      local_198._16_8_ = 0x40;
      local_198._24_8_ = 0;
      local_198._32_8_ = 0;
      local_198._40_4_ = 0;
      local_198._44_4_ = 0;
      local_1d8 = 0;
      ge_00 = (secp256k1_ge *)local_128;
      local_198._8_8_ = (secp256k1_ge *)local_128;
      iVar11 = secp256k1_ec_pubkey_parse
                         (CTX,(secp256k1_pubkey *)local_128,local_128 + 0x40,local_198._80_8_);
      if (iVar11 == 0) {
LAB_00159ce4:
        ec_pubkey_parse_pointtest_cold_14();
LAB_00159ce9:
        ec_pubkey_parse_pointtest_cold_13();
LAB_00159cee:
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_00159cf3;
      }
      local_198._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430005;
      local_198._16_8_ = 0x40;
      local_198._24_8_ = 0;
      local_198._32_8_ = 0;
      local_198._40_4_ = 0;
      local_198._44_4_ = 0;
      local_1a8 = 0x41;
      local_1d8 = 0x4d430001;
      local_1c8 = 0x41;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      uVar15 = 0x102;
      ge_00 = (secp256k1_ge *)local_198;
      psVar14 = CTX;
      local_1d0 = (secp256k1_ge *)local_198;
      local_19c = uVar13;
      local_198._8_8_ = (secp256k1_ge *)local_128;
      iVar11 = secp256k1_ec_pubkey_serialize
                         (CTX,(uchar *)local_198,&local_1a8,(secp256k1_pubkey *)local_128,0x102);
      input = (uchar *)local_198._96_8_;
      if (iVar11 == 0) goto LAB_00159ce9;
      local_1d8 = 0x4d430005;
      local_1c8 = local_1a8;
      local_1c0 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      uVar16 = (ulong)((long)psVar14 << 3) >> 0x33;
      uVar3 = (((long)psVar14 << 3 | (ulong)psVar14 >> 0x3d) << 0xd | uVar16) >> 3;
      psVar14 = (secp256k1_context *)(uVar3 << 0x33 | (uVar16 << 0x3d | uVar3) >> 0xd);
      local_1d0 = (secp256k1_ge *)local_198;
      if (local_1a8 != 0x21) goto LAB_00159cf8;
      lVar12 = 1;
      do {
        bVar1 = local_198[lVar12];
        ge_00 = (secp256k1_ge *)(ulong)bVar1;
        bVar2 = local_128[lVar12 + 0x40];
        psVar14 = (secp256k1_context *)(ulong)bVar2;
        uVar16 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar16 = uVar15 & 0xffffffff;
        }
        iVar11 = (int)uVar16;
        if (bVar1 != bVar2) goto LAB_00159904;
        lVar12 = lVar12 + 1;
        uVar15 = uVar16;
      } while (lVar12 != 0x21);
      iVar11 = 0;
LAB_00159904:
      if (iVar11 != 0) goto LAB_00159cfd;
      if ((local_198._80_8_ == 0x21) && (local_198[0] != local_128[0x40])) goto LAB_00159d02;
      uVar13 = local_19c;
      if (bVar17 != 0) {
        if (local_198[0] != (char)uVar18) goto LAB_00159d07;
        ge_00 = &local_98;
        psVar14 = CTX;
        iVar11 = secp256k1_pubkey_load(CTX,&local_98,(secp256k1_pubkey *)local_128);
        if (iVar11 == 0) goto LAB_00159d0c;
        local_128._48_8_ = 0;
        local_128._56_8_ = 0;
        local_128._32_8_ = 0;
        local_128._40_4_ = 0;
        local_128._44_4_ = 0;
        local_128._16_8_ = 0;
        local_128._24_8_ = 0;
        local_128._0_8_ = 0;
        local_128._8_8_ = 0;
        local_1d8 = 0x4d430001;
        local_1c8 = 0x40;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        local_1d0 = (secp256k1_ge *)local_128;
        secp256k1_ge_to_bytes((uchar *)local_128,&local_98);
        local_1a8 = 0x41;
        local_1d8 = 0x4d430001;
        local_1c8 = 0x41;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        ge_00 = (secp256k1_ge *)local_198;
        psVar14 = CTX;
        local_1d0 = (secp256k1_ge *)local_198;
        iVar11 = secp256k1_ec_pubkey_serialize
                           (CTX,(uchar *)local_198,&local_1a8,(secp256k1_pubkey *)local_128,2);
        if (iVar11 == 0) goto LAB_00159d11;
        local_1d8 = 0x4d430005;
        local_1c8 = local_1a8;
        local_1c0 = 0;
        local_1b8 = 0;
        local_1b0 = 0;
        uVar15 = (ulong)((long)psVar14 << 3) >> 0x33;
        uVar16 = (((long)psVar14 << 3 | (ulong)psVar14 >> 0x3d) << 0xd | uVar15) >> 3;
        psVar14 = (secp256k1_context *)(uVar16 << 0x33 | (uVar15 << 0x3d | uVar16) >> 0xd);
        local_1d0 = (secp256k1_ge *)local_198;
        if (local_1a8 != 0x41) goto LAB_00159d16;
        if (local_198[0] == '\x04') {
          lVar12 = 0;
          do {
            bVar17 = local_198[lVar12 + 1];
            ge_00 = (secp256k1_ge *)(ulong)bVar17;
            bVar1 = input[lVar12];
            psVar14 = (secp256k1_context *)(ulong)bVar1;
            iVar11 = (uint)bVar17 - (uint)bVar1;
            if (bVar17 != bVar1) goto LAB_00159b2c;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x40);
          iVar11 = 0;
LAB_00159b2c:
          uVar13 = local_19c;
          if (iVar11 != 0) goto LAB_00159d20;
          goto LAB_00159c9a;
        }
        goto LAB_00159d1b;
      }
LAB_00159c9a:
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x100);
    local_198._80_8_ = local_198._80_8_ + 1;
    if (local_198._80_8_ == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void ec_pubkey_parse_pointtest(const unsigned char *input, int xvalid, int yvalid) {
    unsigned char pubkeyc[65];
    secp256k1_pubkey pubkey;
    secp256k1_ge ge;
    size_t pubkeyclen;

    for (pubkeyclen = 3; pubkeyclen <= 65; pubkeyclen++) {
        /* Smaller sizes are tested exhaustively elsewhere. */
        int32_t i;
        memcpy(&pubkeyc[1], input, 64);
        SECP256K1_CHECKMEM_UNDEFINE(&pubkeyc[pubkeyclen], 65 - pubkeyclen);
        for (i = 0; i < 256; i++) {
            /* Try all type bytes. */
            int xpass;
            int ypass;
            int ysign;
            pubkeyc[0] = i;
            /* What sign does this point have? */
            ysign = (input[63] & 1) + 2;
            /* For the current type (i) do we expect parsing to work? Handled all of compressed/uncompressed/hybrid. */
            xpass = xvalid && (pubkeyclen == 33) && ((i & 254) == 2);
            /* Do we expect a parse and re-serialize as uncompressed to give a matching y? */
            ypass = xvalid && yvalid && ((i & 4) == ((pubkeyclen == 65) << 2)) &&
                ((i == 4) || ((i & 251) == ysign)) && ((pubkeyclen == 33) || (pubkeyclen == 65));
            if (xpass || ypass) {
                /* These cases must parse. */
                unsigned char pubkeyo[65];
                size_t outl;
                memset(&pubkey, 0, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                outl = 65;
                SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_COMPRESSED) == 1);
                SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                CHECK(outl == 33);
                CHECK(secp256k1_memcmp_var(&pubkeyo[1], &pubkeyc[1], 32) == 0);
                CHECK((pubkeyclen != 33) || (pubkeyo[0] == pubkeyc[0]));
                if (ypass) {
                    /* This test isn't always done because we decode with alternative signs, so the y won't match. */
                    CHECK(pubkeyo[0] == ysign);
                    CHECK(secp256k1_pubkey_load(CTX, &ge, &pubkey) == 1);
                    memset(&pubkey, 0, sizeof(pubkey));
                    SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                    secp256k1_pubkey_save(&pubkey, &ge);
                    SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                    outl = 65;
                    SECP256K1_CHECKMEM_UNDEFINE(pubkeyo, 65);
                    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyo, &outl, &pubkey, SECP256K1_EC_UNCOMPRESSED) == 1);
                    SECP256K1_CHECKMEM_CHECK(pubkeyo, outl);
                    CHECK(outl == 65);
                    CHECK(pubkeyo[0] == 4);
                    CHECK(secp256k1_memcmp_var(&pubkeyo[1], input, 64) == 0);
                }
            } else {
                /* These cases must fail to parse. */
                memset(&pubkey, 0xfe, sizeof(pubkey));
                SECP256K1_CHECKMEM_UNDEFINE(&pubkey, sizeof(pubkey));
                CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 0);
                SECP256K1_CHECKMEM_CHECK(&pubkey, sizeof(pubkey));
                CHECK_ILLEGAL(CTX, secp256k1_pubkey_load(CTX, &ge, &pubkey));
            }
        }
    }
}